

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffload.c
# Opt level: O2

FT_Error cff_blend_build_vector(CFF_Blend blend,FT_UInt vsindex,FT_UInt lenNDV,FT_Fixed *NDV)

{
  CFF_VarData *pCVar1;
  CFF_VarRegion *pCVar2;
  CFF_AxisCoords *pCVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  CFF_Blend pCVar9;
  ulong uVar10;
  FT_Int32 *pFVar11;
  long b_;
  FT_Long FVar12;
  FT_Fixed *__dest;
  int iVar13;
  long *plVar14;
  long a_;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  FT_Error error;
  FT_UInt local_6c;
  long *local_68;
  CFF_Font local_60;
  CFF_Blend local_58;
  ulong local_50;
  FT_Memory local_48;
  CFF_VarData *local_40;
  ulong local_38;
  
  error = 0;
  if (lenNDV == 0 || NDV != (FT_Fixed *)0x0) {
    local_60 = blend->font;
    local_48 = local_60->memory;
    blend->builtBV = '\0';
    if (((lenNDV == 0) || ((local_60->vstore).axisCount == lenNDV)) &&
       (vsindex < (local_60->vstore).dataCount)) {
      pCVar1 = (local_60->vstore).varData;
      uVar15 = pCVar1[vsindex].regionIdxCount + 1;
      local_6c = vsindex;
      pFVar11 = (FT_Int32 *)
                ft_mem_qrealloc(local_48,4,(ulong)blend->lenBV,(ulong)uVar15,blend->BV,&error);
      blend->BV = pFVar11;
      if (error != 0) {
        return error;
      }
      local_40 = pCVar1 + vsindex;
      blend->lenBV = uVar15;
      local_50 = (ulong)lenNDV;
      lVar8 = local_50 * 3;
      local_68 = NDV;
      local_58 = blend;
      local_38 = (ulong)uVar15;
      for (uVar17 = 0; uVar10 = local_50, pCVar9 = local_58, uVar17 != local_38; uVar17 = uVar17 + 1
          ) {
        if (uVar17 == 0) {
          *pFVar11 = 0x10000;
        }
        else {
          uVar15 = local_40->regionIndices[uVar17 - 1];
          if ((local_60->vstore).regionCount <= uVar15) {
            return 3;
          }
          if (lenNDV == 0) {
            pFVar11[uVar17] = 0;
          }
          else {
            pCVar2 = (local_60->vstore).varRegionList;
            pFVar11[uVar17] = 0x10000;
            plVar14 = local_68;
            for (lVar16 = 0; lVar8 != lVar16; lVar16 = lVar16 + 3) {
              pCVar3 = pCVar2[uVar15].axisList;
              lVar4 = (&pCVar3->startCoord)[lVar16];
              lVar5 = (&pCVar3->peakCoord)[lVar16];
              iVar13 = 0x10000;
              if (lVar4 <= lVar5) {
                lVar6 = (&pCVar3->endCoord)[lVar16];
                b_ = lVar6 - lVar5;
                if (lVar5 <= lVar6) {
                  if ((lVar5 != 0) && (-1 < lVar4 || lVar6 < 1)) {
                    lVar7 = *plVar14;
                    if (lVar7 < lVar4) {
                      iVar13 = 0;
                    }
                    else {
                      iVar13 = 0;
                      a_ = lVar6 - lVar7;
                      if ((lVar7 <= lVar6) && (iVar13 = 0x10000, lVar7 != lVar5)) {
                        if (lVar7 < lVar5) {
                          b_ = lVar5 - lVar4;
                          a_ = lVar7 - lVar4;
                        }
                        FVar12 = FT_DivFix(a_,b_);
                        iVar13 = (int)FVar12;
                      }
                    }
                  }
                }
              }
              pFVar11 = local_58->BV;
              pFVar11[uVar17] =
                   (FT_Int32)
                   ((ulong)((long)iVar13 * (long)pFVar11[uVar17] +
                            ((long)iVar13 * (long)pFVar11[uVar17] >> 0x3f) + 0x8000) >> 0x10);
              plVar14 = plVar14 + 1;
            }
          }
        }
      }
      local_58->lastVsindex = local_6c;
      if (lenNDV != 0) {
        __dest = (FT_Fixed *)
                 ft_mem_qrealloc(local_48,8,(ulong)local_58->lenNDV,local_50,local_58->lastNDV,
                                 &error);
        pCVar9->lastNDV = __dest;
        if (error != 0) {
          return error;
        }
        memcpy(__dest,local_68,uVar10 << 3);
      }
      pCVar9->lenNDV = lenNDV;
      pCVar9->builtBV = '\x01';
      return error;
    }
  }
  return 3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_blend_build_vector( CFF_Blend  blend,
                          FT_UInt    vsindex,
                          FT_UInt    lenNDV,
                          FT_Fixed*  NDV )
  {
    FT_Error   error  = FT_Err_Ok;            /* for FT_REALLOC */
    FT_Memory  memory = blend->font->memory;  /* for FT_REALLOC */

    FT_UInt       len;
    CFF_VStore    vs;
    CFF_VarData*  varData;
    FT_UInt       master;


    /* protect against malformed fonts */
    if ( !( lenNDV == 0 || NDV ) )
    {
      FT_TRACE4(( " cff_blend_build_vector:"
                  " Malformed Normalize Design Vector data\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    blend->builtBV = FALSE;

    vs = &blend->font->vstore;

    /* VStore and fvar must be consistent */
    if ( lenNDV != 0 && lenNDV != vs->axisCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: Axis count mismatch\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    if ( vsindex >= vs->dataCount )
    {
      FT_TRACE4(( " cff_blend_build_vector: vsindex out of range\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    /* select the item variation data structure */
    varData = &vs->varData[vsindex];

    /* prepare buffer for the blend vector */
    len = varData->regionIdxCount + 1;    /* add 1 for default component */
    if ( FT_QRENEW_ARRAY( blend->BV, blend->lenBV, len ) )
      goto Exit;

    blend->lenBV = len;

    /* outer loop steps through master designs to be blended */
    for ( master = 0; master < len; master++ )
    {
      FT_UInt         j;
      FT_UInt         idx;
      CFF_VarRegion*  varRegion;


      /* default factor is always one */
      if ( master == 0 )
      {
        blend->BV[master] = FT_FIXED_ONE;
        FT_TRACE4(( "   build blend vector len %d\n", len ));
        FT_TRACE4(( "   [ %f ", blend->BV[master] / 65536.0 ));
        continue;
      }

      /* VStore array does not include default master, so subtract one */
      idx       = varData->regionIndices[master - 1];
      varRegion = &vs->varRegionList[idx];

      if ( idx >= vs->regionCount )
      {
        FT_TRACE4(( " cff_blend_build_vector:"
                    " region index out of range\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      /* Note: `lenNDV' could be zero.                              */
      /*       In that case, build default blend vector (1,0,0...). */
      if ( !lenNDV )
      {
        blend->BV[master] = 0;
        continue;
      }

      /* In the normal case, initialize each component to 1 */
      /* before inner loop.                                 */
      blend->BV[master] = FT_FIXED_ONE; /* default */

      /* inner loop steps through axes in this region */
      for ( j = 0; j < lenNDV; j++ )
      {
        CFF_AxisCoords*  axis = &varRegion->axisList[j];
        FT_Fixed         axisScalar;


        /* compute the scalar contribution of this axis; */
        /* ignore invalid ranges                         */
        if ( axis->startCoord > axis->peakCoord ||
             axis->peakCoord > axis->endCoord   )
          axisScalar = FT_FIXED_ONE;

        else if ( axis->startCoord < 0 &&
                  axis->endCoord > 0   &&
                  axis->peakCoord != 0 )
          axisScalar = FT_FIXED_ONE;

        /* peak of 0 means ignore this axis */
        else if ( axis->peakCoord == 0 )
          axisScalar = FT_FIXED_ONE;

        /* ignore this region if coords are out of range */
        else if ( NDV[j] < axis->startCoord ||
                  NDV[j] > axis->endCoord   )
          axisScalar = 0;

        /* calculate a proportional factor */
        else
        {
          if ( NDV[j] == axis->peakCoord )
            axisScalar = FT_FIXED_ONE;
          else if ( NDV[j] < axis->peakCoord )
            axisScalar = FT_DivFix( NDV[j] - axis->startCoord,
                                    axis->peakCoord - axis->startCoord );
          else
            axisScalar = FT_DivFix( axis->endCoord - NDV[j],
                                    axis->endCoord - axis->peakCoord );
        }

        /* take product of all the axis scalars */
        blend->BV[master] = FT_MulFix( blend->BV[master], axisScalar );
      }

      FT_TRACE4(( ", %f ",
                  blend->BV[master] / 65536.0 ));
    }

    FT_TRACE4(( "]\n" ));

    /* record the parameters used to build the blend vector */
    blend->lastVsindex = vsindex;

    if ( lenNDV != 0 )
    {
      /* user has set a normalized vector */
      if ( FT_QRENEW_ARRAY( blend->lastNDV, blend->lenNDV, lenNDV ) )
        goto Exit;

      FT_MEM_COPY( blend->lastNDV,
                   NDV,
                   lenNDV * sizeof ( *NDV ) );
    }

    blend->lenNDV  = lenNDV;
    blend->builtBV = TRUE;

  Exit:
    return error;
  }